

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgbcl(fitsfile *fptr,int colnum,char *ttype,char *tunit,char *dtype,long *repeat,double *tscal,
          double *tzero,long *tnull,char *tdisp,int *status)

{
  undefined8 *in_R9;
  undefined8 *in_stack_00000018;
  LONGLONG *in_stack_00000020;
  int *in_stack_00000028;
  LONGLONG ttnull;
  LONGLONG trepeat;
  undefined4 in_stack_00000060;
  LONGLONG *in_stack_00000070;
  char *in_stack_00000078;
  int *in_stack_00000080;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 local_14;
  
  if (*in_stack_00000028 < 1) {
    ffgbclll((fitsfile *)dtype,repeat._4_4_,(char *)trepeat,(char *)ttnull,(char *)in_stack_00000028
             ,in_stack_00000020,(double *)CONCAT44(colnum,in_stack_00000060),(double *)fptr,
             in_stack_00000070,in_stack_00000078,in_stack_00000080);
    if (in_R9 != (undefined8 *)0x0) {
      *in_R9 = local_50;
    }
    if (in_stack_00000018 != (undefined8 *)0x0) {
      *in_stack_00000018 = local_58;
    }
    local_14 = *in_stack_00000028;
  }
  else {
    local_14 = *in_stack_00000028;
  }
  return local_14;
}

Assistant:

int ffgbcl( fitsfile *fptr,   /* I - FITS file pointer                      */
            int  colnum,      /* I - column number                          */
            char *ttype,      /* O - TTYPEn keyword value                   */
            char *tunit,      /* O - TUNITn keyword value                   */
            char *dtype,      /* O - datatype char: I, J, E, D, etc.        */
            long *repeat,     /* O - vector column repeat count             */
            double *tscal,    /* O - TSCALn keyword value                   */
            double *tzero,    /* O - TZEROn keyword value                   */
            long *tnull,      /* O - TNULLn keyword value integer cols only */
            char *tdisp,      /* O - TDISPn keyword value                   */
            int  *status)     /* IO - error status                          */
/*
  get BINTABLE column keyword values
*/
{
    LONGLONG trepeat, ttnull;
    
    if (*status > 0)
        return(*status);

    ffgbclll(fptr, colnum, ttype, tunit, dtype, &trepeat, tscal, tzero,
             &ttnull, tdisp, status);

    if (repeat)
        *repeat = (long) trepeat;

    if (tnull)
        *tnull = (long) ttnull;

    return(*status);
}